

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_map.hpp
# Opt level: O0

void run<boost::container::flat_map<unsigned_int,double,std::less<unsigned_int>,void>,unsigned_int,double>
               (vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                *A,vector<unsigned_int,_std::allocator<unsigned_int>_> *B_rows,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *B_cols,
               vector<double,_std::allocator<double>_> *B_values)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  value_type vVar4;
  size_type sVar5;
  size_type sVar6;
  pointer ppVar7;
  reference pvVar8;
  flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void> *pfVar9;
  reference pvVar10;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  *in_RDI;
  uint B_nnz_index;
  uint col_in_A;
  const_iterator it_1;
  size_t row_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> B_offsets;
  uint tmp;
  size_t row_1;
  uint offset;
  const_iterator it;
  size_t row;
  size_t i;
  size_t B_nnz;
  flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void> *in_stack_ffffffffffffff10;
  double dVar11;
  flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void> *in_stack_ffffffffffffff18;
  flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void> *this;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar12;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff30;
  ulong uVar13;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff60;
  vec_iterator<std::pair<unsigned_int,_double>_*,_true> local_90;
  vec_iterator<std::pair<unsigned_int,_double>_*,_true> local_88;
  flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void> *local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  value_type local_5c;
  ulong local_58;
  value_type local_4c;
  vec_iterator<std::pair<unsigned_int,_double>_*,_true> local_48;
  vec_iterator<std::pair<unsigned_int,_double>_*,_true> local_40;
  ulong local_38;
  ulong local_30;
  long local_28;
  vector<double,_std::allocator<double>_> *local_20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_10;
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  *local_8;
  
  local_28 = 0;
  local_30 = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    uVar13 = local_30;
    sVar5 = std::
            vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
            ::size(local_8);
    if (sVar5 <= uVar13) break;
    std::
    vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
    ::operator[](local_8,local_30);
    sVar6 = boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>::size
                      (in_stack_ffffffffffffff10);
    local_28 = sVar6 + local_28;
    local_30 = local_30 + 1;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff30,
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_ffffffffffffff30,CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
            );
  std::
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  ::size(local_8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff30,
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  local_38 = 0;
  while( true ) {
    uVar13 = local_38;
    sVar5 = std::
            vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
            ::size(local_8);
    if (sVar5 <= uVar13) break;
    std::
    vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
    ::operator[](local_8,local_38);
    boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>::begin
              (in_stack_ffffffffffffff18);
    while( true ) {
      std::
      vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ::operator[](local_8,local_38);
      boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>::end
                (in_stack_ffffffffffffff18);
      bVar3 = boost::container::operator!=(&local_40,&local_48);
      pvVar12 = local_10;
      if (!bVar3) break;
      ppVar7 = boost::container::vec_iterator<std::pair<unsigned_int,_double>_*,_true>::operator->
                         (&local_40);
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar12,(ulong)ppVar7->first);
      *pvVar8 = *pvVar8 + 1;
      boost::container::vec_iterator<std::pair<unsigned_int,_double>_*,_true>::operator++(&local_40)
      ;
    }
    local_38 = local_38 + 1;
  }
  local_4c = 0;
  local_58 = 0;
  while( true ) {
    uVar13 = local_58;
    sVar5 = std::
            vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
            ::size(local_8);
    if (sVar5 <= uVar13) break;
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_10,local_58)
    ;
    local_5c = *pvVar8;
    vVar4 = local_4c;
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_10,local_58)
    ;
    *pvVar8 = vVar4;
    local_4c = local_5c + local_4c;
    local_58 = local_58 + 1;
  }
  pvVar12 = local_10;
  vVar4 = local_4c;
  sVar5 = std::
          vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
          ::size(local_8);
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar12,sVar5);
  *pvVar8 = vVar4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  local_80 = (flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void> *)0x0;
  while( true ) {
    this = local_80;
    pfVar9 = (flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void> *)
             std::
             vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
             ::size(local_8);
    if (pfVar9 <= this) break;
    std::
    vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
    ::operator[](local_8,(size_type)local_80);
    boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>::begin(this);
    while( true ) {
      std::
      vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ::operator[](local_8,(size_type)local_80);
      boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>::end(this);
      bVar3 = boost::container::operator!=(&local_88,&local_90);
      if (!bVar3) break;
      ppVar7 = boost::container::vec_iterator<std::pair<unsigned_int,_double>_*,_true>::operator->
                         (&local_88);
      uVar1 = ppVar7->first;
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_78,(ulong)uVar1);
      uVar2 = *pvVar8;
      vVar4 = (value_type)local_80;
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (local_18,(ulong)uVar2);
      *pvVar8 = vVar4;
      ppVar7 = boost::container::vec_iterator<std::pair<unsigned_int,_double>_*,_true>::operator->
                         (&local_88);
      dVar11 = ppVar7->second;
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(ulong)uVar2);
      *pvVar10 = dVar11;
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_78,(ulong)uVar1);
      *pvVar8 = *pvVar8 + 1;
      boost::container::vec_iterator<std::pair<unsigned_int,_double>_*,_true>::operator++(&local_88)
      ;
    }
    local_80 = (flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void> *)
               ((long)&(local_80->m_flat_tree).m_data.m_seq.m_holder.m_start + 1);
  }
  do_nothing(local_10,local_18,local_20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(pvVar12);
  return;
}

Assistant:

void run(std::vector<RowT> const & A,
         std::vector<IndexT> & B_rows,
         std::vector<IndexT> & B_cols,
         std::vector<NumericT> & B_values)
{
  std::size_t B_nnz = 0;

  for (std::size_t i = 0; i < A.size(); ++i)
    B_nnz += A[i].size();

  // initialize datastructures for B:
  B_cols.resize(B_nnz);    // note: initialization with zero not strictly required
  B_values.resize(B_nnz);  // note: initialization with zero not strictly required
  B_rows.resize(A.size() + 1);

  //
  // Stage 1: Compute nonzero pattern for B
  //
  for (std::size_t row = 0; row < A.size(); ++row)
  {
    for (typename RowT::const_iterator it = A[row].begin(); it != A[row].end(); ++it)
      B_rows[it->first] += 1;
  }

  // Bring row-start array in place using exclusive-scan:
  IndexT offset = 0;
  for (std::size_t row = 0; row < A.size(); ++row)
  {
    IndexT tmp = B_rows[row];
    B_rows[row] = offset;
    offset += tmp;
  }
  B_rows[A.size()] = offset;


  //
  // Stage 2: Fill with data
  //
  std::vector<IndexT> B_offsets(B_rows); // index of first unwritten element per row

  for (std::size_t row = 0; row < A.size(); ++row)
  {
    for (typename RowT::const_iterator it = A[row].begin(); it != A[row].end(); ++it)
    {
      IndexT col_in_A = it->first;
      IndexT B_nnz_index = B_offsets[col_in_A];
      B_cols[B_nnz_index] = row;
      B_values[B_nnz_index] = it->second;
      B_offsets[col_in_A] += 1;
    }
  }

  do_nothing(B_rows, B_cols, B_values);
}